

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_linal_msq1T_u(double *res,double *v,size_t m,size_t n)

{
  size_t mn;
  size_t k;
  size_t i;
  size_t j1;
  size_t j;
  size_t n_local;
  size_t m_local;
  double *v_local;
  double *res_local;
  
  mn = 0;
  for (j1 = 0; j1 < n; j1 = j1 + 1) {
    for (i = j1; i < n; i = i + 1) {
      k = 0;
      res[mn] = 0.0;
      for (; k < m * n; k = n + k) {
        res[mn] = v[k + j1] * v[k + i] + res[mn];
      }
      mn = mn + 1;
    }
  }
  return;
}

Assistant:

void fsnav_linal_msq1T_u(double* res, double* v, const size_t m, const size_t n)
{
	size_t j, j1, i, k, mn;

	mn = m*n;
	for (j = 0, j1 = 0, k = 0; j < n; j++)
		for (j1 = j; j1 < n; j1++, k++)
			for (i = 0, res[k] = 0; i < mn; i += n)
				res[k] += v[i+j]*v[i+j1];
}